

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_type.c
# Opt level: O0

void al_convert_memory_bitmaps(void)

{
  _Bool _Var1;
  ALLEGRO_DISPLAY *channel;
  size_t sVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ALLEGRO_BITMAP *pAVar5;
  int flags;
  ALLEGRO_BITMAP **bptr_1;
  ALLEGRO_BITMAP **bptr2;
  ALLEGRO_BITMAP **bptr;
  size_t i;
  _AL_VECTOR copy;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_STATE backup;
  _AL_VECTOR *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffbc8;
  int iVar6;
  ALLEGRO_STATE *in_stack_fffffffffffffbd0;
  ulong uVar7;
  ulong uVar8;
  ALLEGRO_BITMAP *pAVar9;
  ALLEGRO_BITMAP *bitmap;
  char *in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe4;
  char *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf4;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  channel = al_get_current_display();
  if (channel != (ALLEGRO_DISPLAY *)0x0) {
    al_store_state(in_stack_fffffffffffffbd0,iVar6);
    al_lock_mutex((ALLEGRO_MUTEX *)0x1498c9);
    _al_vector_init((_AL_VECTOR *)&stack0xfffffffffffffbd8,8);
    uVar7 = 0;
    while (uVar8 = uVar7, sVar2 = _al_vector_size(&convert_bitmap_list.bitmaps), uVar7 < sVar2) {
      puVar3 = (undefined8 *)_al_vector_ref(&convert_bitmap_list.bitmaps,(uint)uVar8);
      puVar4 = (undefined8 *)_al_vector_alloc_back(in_stack_fffffffffffffb98);
      *puVar4 = *puVar3;
      uVar7 = uVar8 + 1;
    }
    _al_vector_free((_AL_VECTOR *)0x149963);
    _al_vector_init(&convert_bitmap_list.bitmaps,8);
    pAVar9 = (ALLEGRO_BITMAP *)0x0;
    while (bitmap = pAVar9,
          pAVar5 = (ALLEGRO_BITMAP *)_al_vector_size((_AL_VECTOR *)&stack0xfffffffffffffbd8),
          pAVar9 < pAVar5) {
      puVar3 = (undefined8 *)_al_vector_ref((_AL_VECTOR *)&stack0xfffffffffffffbd8,(uint)bitmap);
      iVar6 = (int)((ulong)pAVar9 >> 0x20);
      al_get_bitmap_flags((ALLEGRO_BITMAP *)*puVar3);
      al_set_new_bitmap_flags(iVar6);
      al_get_bitmap_format((ALLEGRO_BITMAP *)*puVar3);
      al_set_new_bitmap_format(iVar6);
      _Var1 = _al_trace_prefix((char *)channel,in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,
                               in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8);
      if (_Var1) {
        _al_trace_suffix("converting memory bitmap %p to display bitmap\n",*puVar3);
      }
      al_convert_bitmap(bitmap);
      pAVar9 = (ALLEGRO_BITMAP *)((long)&bitmap->vt + 1);
    }
    _al_vector_free((_AL_VECTOR *)0x149a5c);
    al_unlock_mutex((ALLEGRO_MUTEX *)0x149a68);
    al_restore_state((ALLEGRO_STATE *)bitmap);
  }
  return;
}

Assistant:

void al_convert_memory_bitmaps(void)
{
   ALLEGRO_STATE backup;
   ALLEGRO_DISPLAY *display = al_get_current_display();
   _AL_VECTOR copy;
   size_t i;
   if (!display) return;
   
   al_store_state(&backup, ALLEGRO_STATE_NEW_BITMAP_PARAMETERS);

   al_lock_mutex(convert_bitmap_list.mutex);
   
   _al_vector_init(&copy, sizeof(ALLEGRO_BITMAP *));
   for (i = 0; i <  _al_vector_size(&convert_bitmap_list.bitmaps); i++) {
      ALLEGRO_BITMAP **bptr, **bptr2;
      bptr = _al_vector_ref(&convert_bitmap_list.bitmaps, i);
      bptr2 = _al_vector_alloc_back(&copy);
      *bptr2 = *bptr;
   }
   _al_vector_free(&convert_bitmap_list.bitmaps);
   _al_vector_init(&convert_bitmap_list.bitmaps, sizeof(ALLEGRO_BITMAP *));
   for (i = 0; i < _al_vector_size(&copy); i++) {
      ALLEGRO_BITMAP **bptr;
      int flags;
      bptr = _al_vector_ref(&copy, i);
      flags = al_get_bitmap_flags(*bptr);
      flags &= ~ALLEGRO_MEMORY_BITMAP;
      al_set_new_bitmap_flags(flags);
      al_set_new_bitmap_format(al_get_bitmap_format(*bptr));
      
      ALLEGRO_DEBUG("converting memory bitmap %p to display bitmap\n", *bptr);
      
      al_convert_bitmap(*bptr);
   }

   _al_vector_free(&copy);

   al_unlock_mutex(convert_bitmap_list.mutex);

   al_restore_state(&backup);
}